

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::compiler::Version::_InternalParse(Version *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint32_t uVar2;
  string *s;
  UnknownFieldSet *unknown;
  char cVar3;
  ulong tag_00;
  uint uVar4;
  uint32_t tag;
  char *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_Message).super_MessageLite._internal_metadata_;
  uVar4 = 0;
  local_48 = ptr;
  do {
    bVar1 = internal::ParseContext::Done(ctx,&local_48);
    if (bVar1) goto LAB_002bcf97;
    local_48 = internal::ReadTag(local_48,&local_3c,0);
    tag_00 = (ulong)local_3c;
    cVar3 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar3 != '\b') break;
      uVar4 = uVar4 | 2;
      uVar2 = internal::ReadVarint32(&local_48);
      this->major_ = uVar2;
      goto joined_r0x002bcf89;
    case 2:
      if (cVar3 == '\x10') {
        uVar4 = uVar4 | 4;
        uVar2 = internal::ReadVarint32(&local_48);
        this->minor_ = uVar2;
        goto joined_r0x002bcf89;
      }
      break;
    case 3:
      if (cVar3 == '\x18') {
        uVar4 = uVar4 | 8;
        uVar2 = internal::ReadVarint32(&local_48);
        this->patch_ = uVar2;
        goto joined_r0x002bcf89;
      }
      break;
    case 4:
      if (cVar3 == '\"') {
        s = _internal_mutable_suffix_abi_cxx11_(this);
        local_48 = internal::InlineGreedyStringParser(s,local_48,ctx);
        internal::VerifyUTF8(s,"google.protobuf.compiler.Version.suffix");
        goto joined_r0x002bcf89;
      }
    }
    if ((tag_00 == 0) || ((local_3c & 7) == 4)) {
      if (local_48 != (char *)0x0) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
        goto LAB_002bcf97;
      }
      goto LAB_002bcf8f;
    }
    unknown = internal::InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                        (local_38);
    local_48 = internal::UnknownFieldParse(tag_00,unknown,local_48,ctx);
joined_r0x002bcf89:
    if (local_48 == (char *)0x0) {
LAB_002bcf8f:
      local_48 = (char *)0x0;
LAB_002bcf97:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
      return local_48;
    }
  } while( true );
}

Assistant:

const char* Version::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional int32 major = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          _Internal::set_has_major(&has_bits);
          major_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional int32 minor = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          _Internal::set_has_minor(&has_bits);
          minor_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional int32 patch = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          _Internal::set_has_patch(&has_bits);
          patch_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional string suffix = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          auto str = _internal_mutable_suffix();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.Version.suffix");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}